

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O1

bool saves_spell(int level,CHAR_DATA *victim,int dam_type)

{
  short sVar1;
  short sVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  AFFECT_DATA *pAVar7;
  float fVar8;
  double dVar9;
  float local_20;
  
  if ((victim->fighting == (CHAR_DATA *)0x0) || (iVar5 = get_trust(victim->fighting), iVar5 != 0x3c)
     ) {
    sVar1 = victim->saving_throw;
    if (sVar1 < 0) {
      sVar2 = victim->level;
      dVar9 = (double)-(int)sVar1;
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      dVar9 = dVar9 * 4.0 + (double)((sVar2 - level) * 4 + 0x28);
    }
    else {
      sVar2 = victim->level;
      dVar9 = (double)(int)sVar1;
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      dVar9 = (double)((sVar2 - level) * 4 + 0x2d) + dVar9 * -4.0;
    }
    local_20 = (float)dVar9;
    bVar3 = is_npc(victim);
    if (bVar3) {
      local_20 = local_20 + (float)(int)(victim->level / 3);
    }
    iVar5 = check_immune(victim,dam_type);
    bVar3 = true;
    if (iVar5 != 1) {
      if (iVar5 == 3) {
        local_20 = local_20 * 0.7;
      }
      else if (iVar5 == 2) {
        bVar4 = is_npc(victim);
        if ((bVar4) || (bVar4 = str_cmp(pc_race_table[victim->race].name,"imp"), bVar4)) {
          local_20 = local_20 * 1.3;
        }
        else {
          local_20 = local_20 * 1.1;
        }
      }
      iVar5 = skill_lookup("strength of faith");
      bVar4 = is_affected(victim,iVar5);
      if ((!bVar4) || (iVar5 = number_percent(), dam_type != 10 && 0x31 < iVar5)) {
        bVar3 = is_affected(victim,(int)gsn_traitors_luck);
        if (bVar3) {
          pAVar7 = affect_find(victim->affected,(int)gsn_traitors_luck);
          if ((victim->fighting != (CHAR_DATA *)0x0) && (victim->fighting == pAVar7->owner)) {
            local_20 = local_20 + -50.0;
          }
        }
        bVar3 = is_affected_room(victim->in_room,(int)gsn_infidels_fate);
        if ((bVar3) && (bVar3 = is_good(victim), bVar3)) {
          local_20 = local_20 + -20.0;
        }
        iVar5 = 5;
        if (5.0 <= local_20) {
          fVar8 = 95.0;
          if (local_20 <= 95.0) {
            fVar8 = local_20;
          }
          iVar5 = (int)fVar8;
        }
        iVar6 = number_percent();
        bVar3 = iVar6 < iVar5;
      }
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool saves_spell(int level, CHAR_DATA *victim, int dam_type)
{
	int roll;
	float save;
	AFFECT_DATA *af;
	//    char buf[MSL];
	if (victim->fighting && get_trust(victim->fighting) == MAX_LEVEL)
		return false;

	if (victim->saving_throw < 0)
		save = 40 + (victim->level - level) * 4 + (sqrt(abs(victim->saving_throw))) * 4;
	else
		save = 45 + (victim->level - level) * 4 - (sqrt(victim->saving_throw)) * 4;

	if (is_npc(victim))
		save += victim->level / 3; /* simulate npc saving throw */

	switch (check_immune(victim, dam_type))
	{
		case IS_IMMUNE:
			return true;
		case IS_RESISTANT:
			if (!is_npc(victim) && !str_cmp(pc_race_table[victim->race].name, "imp"))
				save *= 1.1;
			else
				save *= 1.3;

			break;
		case IS_VULNERABLE:
			save *= .7;
			break;
	}

	if (is_affected(victim, skill_lookup("strength of faith")) && (number_percent() < 50 || dam_type == DAM_HOLY))
		return true;

	/*
	if (!is_npc(victim) && victim->Class()->fMana)
		save = 9 * save / 10;
	*/

	if (is_affected(victim, gsn_traitors_luck))
	{
		af = affect_find(victim->affected, gsn_traitors_luck);
		if (victim->fighting && (victim->fighting == af->owner))
			save -= 50;
	}

	if (is_affected_room(victim->in_room, gsn_infidels_fate) && is_good(victim))
		save -= 20;

	save = URANGE(5, save, 95);
	roll = number_percent();

	/*
	if(victim->fighting && !is_npc(victim->fighting) && !is_npc(victim))
	{
		sprintf(buf,"Saves_spell: Caster is probably %s, victim is %s, dt is %d.  Victim level %d, spell level %d (%d - %.2f%%mod)."\
			" Victim has %dsvs (%.2f%%mod).  Chance of saving is %d, roll is %d: %s",
			victim->fighting->name,
			victim->true_name,
			dam_type,
			victim->level,
			level,
			victim->level - level,
			(float)((victim->level - level) * 4),
			victim->saving_throw,
			(float)sqrt(abs(victim->saving_throw)) * 4,
			save,
			roll,
			roll < save ? "SAVED" : "FAILED");
		wiznet(buf,0,nullptr,WIZ_DEBUG,0,0);
	}
	else if(!is_npc(victim))
	{
		sprintf(buf,"Saves_spell: victim is %s.  Victim level %d, spell level %d (%d - %.2f%%mod).",
			victim->name,
			victim->level,
			level,
			victim->level - level,
			(float)((victim->level - level) * 4));
		wiznet(buf,0,nullptr,WIZ_DEBUG,0,0);
	}
	*/

	return (roll < (int)save);
}